

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void StoreSymbol(BlockEncoder *self,size_t symbol,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  char *__assertion;
  ulong uVar9;
  uint uVar10;
  
  sVar7 = self->block_len_;
  if (sVar7 == 0) {
    sVar7 = self->block_ix_;
    self->block_ix_ = sVar7 + 1;
    uVar10 = self->block_lengths_[sVar7 + 1];
    uVar4 = (ulong)self->block_types_[sVar7 + 1];
    self->block_len_ = (ulong)uVar10;
    self->entropy_ix_ = self->alphabet_size_ * uVar4;
    sVar7 = (self->block_split_code_).type_code_calculator.last_type;
    if (sVar7 + 1 == uVar4) {
      lVar8 = 1;
    }
    else {
      lVar8 = 0;
      if ((self->block_split_code_).type_code_calculator.second_last_type != uVar4) {
        lVar8 = uVar4 + 2;
      }
    }
    (self->block_split_code_).type_code_calculator.second_last_type = sVar7;
    (self->block_split_code_).type_code_calculator.last_type = uVar4;
    bVar1 = (self->block_split_code_).type_depths[lVar8];
    uVar2 = (self->block_split_code_).type_bits[lVar8];
    if (uVar2 >> (bVar1 & 0x3f) == 0) {
      if (0x38 < bVar1) {
LAB_0011682b:
        __assertion = "n_bits <= 56";
        uVar10 = 0x37;
        goto LAB_00116842;
      }
      uVar4 = *storage_ix;
      uVar9 = bVar1 + uVar4;
      *(ulong *)(storage + (uVar4 >> 3)) =
           (ulong)uVar2 << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
      *storage_ix = uVar9;
      uVar4 = 0xe;
      if (0x2f0 < uVar10) {
        uVar4 = 0x14;
      }
      uVar5 = 7;
      if (uVar10 < 0x29) {
        uVar5 = 0;
      }
      if (0xb0 < uVar10) {
        uVar5 = uVar4;
      }
      do {
        uVar6 = uVar5;
        uVar4 = 0x19;
        if (0x18 < uVar6) break;
        uVar5 = uVar6 + 1;
        uVar4 = uVar6;
      } while (kBlockLengthPrefixCode[uVar6 + 1].offset <= uVar10);
      bVar1 = (self->block_split_code_).length_depths[uVar4];
      uVar2 = (self->block_split_code_).length_bits[uVar4];
      if (uVar2 >> (bVar1 & 0x3f) == 0) {
        if (0x38 < bVar1) goto LAB_0011682b;
        uVar3 = kBlockLengthPrefixCode[uVar4].nbits;
        uVar10 = uVar10 - kBlockLengthPrefixCode[uVar4].offset;
        *(ulong *)(storage + (uVar9 >> 3)) =
             (ulong)uVar2 << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
        uVar9 = bVar1 + uVar9;
        *storage_ix = uVar9;
        if (uVar10 >> ((byte)uVar3 & 0x3f) == 0) {
          *(ulong *)(storage + (uVar9 >> 3)) =
               (ulong)uVar10 << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
          *storage_ix = uVar3 + uVar9;
          sVar7 = self->block_len_;
          goto LAB_001167af;
        }
      }
    }
  }
  else {
LAB_001167af:
    self->block_len_ = sVar7 - 1;
    lVar8 = symbol + self->entropy_ix_;
    bVar1 = self->depths_[lVar8];
    if (self->bits_[lVar8] >> (bVar1 & 0x3f) == 0) {
      if (bVar1 < 0x39) {
        uVar4 = *storage_ix;
        *(ulong *)(storage + (uVar4 >> 3)) =
             (ulong)self->bits_[lVar8] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
        *storage_ix = bVar1 + uVar4;
        return;
      }
      goto LAB_0011682b;
    }
  }
  __assertion = "(bits >> n_bits) == 0";
  uVar10 = 0x36;
LAB_00116842:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                ,uVar10,
                "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
}

Assistant:

static void StoreSymbol(BlockEncoder* self, size_t symbol, size_t* storage_ix,
    uint8_t* storage) {
  if (self->block_len_ == 0) {
    size_t block_ix = ++self->block_ix_;
    uint32_t block_len = self->block_lengths_[block_ix];
    uint8_t block_type = self->block_types_[block_ix];
    self->block_len_ = block_len;
    self->entropy_ix_ = block_type * self->alphabet_size_;
    StoreBlockSwitch(&self->block_split_code_, block_len, block_type, 0,
        storage_ix, storage);
  }
  --self->block_len_;
  {
    size_t ix = self->entropy_ix_ + symbol;
    BrotliWriteBits(self->depths_[ix], self->bits_[ix], storage_ix, storage);
  }
}